

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

result<double,_toml::error_info> *
toml::read_dec_float<double>
          (result<double,_toml::error_info> *__return_storage_ptr__,string *str,source_location *src
          )

{
  allocator<char> local_30a;
  allocator<char> local_309;
  double val;
  string local_300;
  string local_2e0;
  source_location local_2c0;
  error_info local_248;
  istringstream iss;
  byte abStack_1d0 [352];
  error_info local_70;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&iss,(string *)str,_S_in);
  std::istream::_M_extract<double>((double *)&iss);
  if ((abStack_1d0[*(long *)(_iss + -0x18)] & 5) == 0) {
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ_.value = val;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,
               "toml::parse_floating: failed to read floating point value from stream",&local_309);
    source_location::source_location(&local_2c0,src);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"here",&local_30a);
    make_error_info<>(&local_248,&local_2e0,&local_2c0,&local_300);
    err<toml::error_info>((failure<toml::error_info> *)&local_70,&local_248);
    result<double,_toml::error_info>::result(__return_storage_ptr__,(failure_type *)&local_70);
    error_info::~error_info(&local_70);
    error_info::~error_info(&local_248);
    std::__cxx11::string::~string((string *)&local_300);
    source_location::~source_location(&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&iss);
  return __return_storage_ptr__;
}

Assistant:

result<T, error_info>
read_dec_float(const std::string& str, const source_location src)
{
    T val;
    std::istringstream iss(str);
    iss >> val;
    if(iss.fail())
    {
        return err(make_error_info("toml::parse_floating: "
            "failed to read floating point value from stream",
            std::move(src), "here"));
    }
    return ok(val);
}